

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::RegexPattern::RegexPattern
          (RegexPattern *this,JavascriptLibrary *library,Program *program,bool isLiteral)

{
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  byte local_21;
  Program *pPStack_20;
  bool isLiteral_local;
  Program *program_local;
  JavascriptLibrary *library_local;
  RegexPattern *this_local;
  
  local_21 = isLiteral;
  pPStack_20 = program;
  program_local = (Program *)library;
  library_local = (JavascriptLibrary *)this;
  FinalizableObject::FinalizableObject(&this->super_FinalizableObject);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e50a20;
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<UnifiedRegex::RegExpTestCache>::WriteBarrierPtr
            (&this->testCache,&local_30);
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::WriteBarrierPtr
            (&this->library,(JavascriptLibrary *)program_local);
  this->field_0x18 = this->field_0x18 & 0xfe | local_21 & 1;
  this->field_0x18 = this->field_0x18 & 0xfd;
  Rep::Rep((Rep *)&(this->rep).unified);
  Memory::WriteBarrierPtr<UnifiedRegex::Program>::operator=(&(this->rep).unified.program,pPStack_20)
  ;
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<UnifiedRegex::Matcher>::operator=(&(this->rep).unified.matcher,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<UnifiedRegex::TrigramInfo>::operator=
            (&(this->rep).unified.trigramInfo,&local_40);
  return;
}

Assistant:

RegexPattern::RegexPattern(Js::JavascriptLibrary *const library, Program* program, bool isLiteral)
        : library(library), isLiteral(isLiteral), isShallowClone(false), testCache(nullptr)
    {
        rep.unified.program = program;
        rep.unified.matcher = nullptr;
        rep.unified.trigramInfo = nullptr;
    }